

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_page.cpp
# Opt level: O1

void __thiscall http::Page::Process(Page *this,char *htmlFile,char *marker,MarkerContent content)

{
  ostream *poVar1;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  char local_39;
  MarkerContent local_38;
  
  local_38 = content;
  __stream = fopen(htmlFile,"r");
  if (__stream == (FILE *)0x0) {
    printf("failed to open file \'%s\'\n",htmlFile);
    return;
  }
  sVar3 = strlen(marker);
  iVar2 = fgetc(__stream);
  if (0 < iVar2) {
    poVar1 = &this->m_ostream;
    iVar5 = 0;
    do {
      if (iVar2 == marker[iVar5]) {
        iVar5 = iVar5 + 1;
        if (iVar5 == (int)sVar3) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"<!-- ",5);
          if (marker == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(*(long *)poVar1 + -0x18) + (int)poVar1);
          }
          else {
            sVar4 = strlen(marker);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,marker,sVar4);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar1," start -->",10);
          (*local_38)(this);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"<!-- ",5);
          if (marker == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(*(long *)poVar1 + -0x18) + (int)poVar1);
          }
          else {
            sVar4 = strlen(marker);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,marker,sVar4);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar1," end -->",8);
LAB_0010536a:
          iVar5 = 0;
        }
      }
      else {
        if (0 < iVar5) {
          std::ostream::write((char *)poVar1,(long)marker);
          goto LAB_0010536a;
        }
        local_39 = (char)iVar2;
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_39,1);
      }
      iVar2 = fgetc(__stream);
    } while (0 < iVar2);
  }
  return;
}

Assistant:

void http::Page::Process(const char* htmlFile, const char* marker, MarkerContent content)
{
    FILE* f = fopen(htmlFile, "r");
    if (f)
    {
        int c;
        int markerIndex = 0;
        int markerLength = strlen(marker);
        std::ostream& out = get_output_stream();
        while ((c = fgetc(f)) > 0)
        {
            if (c == marker[markerIndex])
            {
                markerIndex++;
                if (markerIndex == markerLength)
                {
                    // found the marker
                    markerIndex = 0;
                    out << "<!-- ";
                    out << marker;
                    out << " start -->";
                    content(this);
                    out << "<!-- ";
                    out << marker;
                    out << " end -->";
                }
            }
            else if (markerIndex > 0)
            {
                // Send the part of the marker that matched so far
                out.write(marker, markerIndex);
                markerIndex = 0;
            }
            else
            {
                char ch = c;
                out << ch;
            }
        }
    }
    else
    {
        printf("failed to open file '%s'\n", htmlFile);
    }
}